

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O3

REF_STATUS ref_face_part(REF_FACE ref_face,REF_NODE ref_node,REF_INT face,REF_INT *part)

{
  int iVar1;
  REF_INT *pRVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  pRVar2 = ref_face->f2n;
  iVar3 = face * 4;
  iVar1 = pRVar2[iVar3];
  lVar5 = -1;
  if ((-1 < (long)iVar1) && (iVar1 < ref_node->max)) {
    lVar5 = -1;
    if (-1 < ref_node->global[iVar1]) {
      lVar5 = ref_node->global[iVar1];
    }
  }
  uVar6 = 0;
  uVar7 = 1;
  do {
    iVar1 = pRVar2[(long)iVar3 + uVar7];
    lVar4 = -1;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar4 = ref_node->global[iVar1], lVar4 < 0)) {
      lVar4 = -1;
    }
    if (lVar4 < lVar5) {
      uVar6 = uVar7 & 0xffffffff;
      lVar5 = lVar4;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 4);
  *part = ref_node->part[pRVar2[(int)uVar6 + iVar3]];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_face_part(REF_FACE ref_face, REF_NODE ref_node,
                                 REF_INT face, REF_INT *part) {
  REF_GLOB global, smallest_global;
  REF_INT node, smallest_global_node;

  /* set first node as smallest */
  node = 0;
  global = ref_node_global(ref_node, ref_face_f2n(ref_face, node, face));
  smallest_global = global;
  smallest_global_node = node;
  /* search other nodes for smaller global */
  for (node = 1; node < 4; node++) {
    global = ref_node_global(ref_node, ref_face_f2n(ref_face, node, face));
    if (global < smallest_global) {
      smallest_global = global;
      smallest_global_node = node;
    }
  }

  *part = ref_node_part(ref_node,
                        ref_face_f2n(ref_face, smallest_global_node, face));

  return REF_SUCCESS;
}